

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::IfcOccupant(IfcOccupant *this)

{
  *(undefined ***)&this->field_0x120 = &PTR__Object_008a0070;
  *(undefined8 *)&this->field_0x128 = 0;
  *(char **)&this->field_0x130 = "IfcOccupant";
  IfcActor::IfcActor(&this->super_IfcActor,&PTR_construction_vtable_24__008d2bf8);
  *(undefined8 *)&(this->super_IfcActor).field_0xf8 = 0;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject = 0x8d2b18;
  *(undefined8 *)&this->field_0x120 = 0x8d2be0;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject.field_0x88 = 0x8d2b40;
  (this->super_IfcActor).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0x8d2b68;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject.field_0xd0 = 0x8d2b90;
  *(undefined8 *)&(this->super_IfcActor).field_0xf0 = 0x8d2bb8;
  *(undefined1 **)&(this->super_IfcActor).field_0x100 = &this->field_0x110;
  *(undefined8 *)&this->field_0x108 = 0;
  this->field_0x110 = 0;
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}